

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::LogUncover(Polymer *this,string *species_name)

{
  size_type sVar1;
  mapped_type_conflict *pmVar2;
  SpeciesTracker *this_00;
  int iVar3;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->uncovered_,species_name);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->uncovered_,species_name);
  iVar3 = *pmVar2 + 1;
  if (sVar1 == 0) {
    iVar3 = 1;
  }
  *pmVar2 = iVar3;
  this_00 = SpeciesTracker::Instance();
  SpeciesTracker::Increment(this_00,species_name,1);
  return;
}

Assistant:

void Polymer::LogUncover(const std::string &species_name) {
  if (uncovered_.count(species_name) == 0) {
    uncovered_[species_name] = 1;
  } else {
    uncovered_[species_name]++;
  }
  SpeciesTracker::Instance().Increment(species_name, 1);
}